

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O0

void __thiscall wabt::anon_unknown_1::WatWriter::WriteField(WatWriter *this,Field *field)

{
  Field *field_local;
  WatWriter *this_local;
  
  if ((field->mutable_ & 1U) != 0) {
    WriteOpenSpace(this,"mut");
  }
  WriteType(this,field->type,Space);
  if ((field->mutable_ & 1U) != 0) {
    WriteCloseSpace(this);
  }
  return;
}

Assistant:

void WatWriter::WriteField(const Field& field) {
  if (field.mutable_) {
    WriteOpenSpace("mut");
  }
  WriteType(field.type, NextChar::Space);
  if (field.mutable_) {
    WriteCloseSpace();
  }
}